

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  code *pcVar4;
  secp256k1_fe t;
  secp256k1_fe r;
  secp256k1_fe local_a0;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  pcVar4 = secp256k1_fe_impl_inv_var;
  if (var == 0) {
    pcVar4 = secp256k1_fe_impl_inv;
  }
  (*pcVar4)(&local_a0);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_a0.n[4];
    out->n[2] = local_a0.n[2];
    out->n[3] = local_a0.n[3];
    out->n[0] = local_a0.n[0];
    out->n[1] = local_a0.n[1];
  }
  local_78.n[4] = x->n[4];
  local_78.n[0] = x->n[0];
  local_78.n[1] = x->n[1];
  local_78.n[2] = x->n[2];
  local_78.n[3] = x->n[3];
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_78);
  if (iVar1 == 0) {
    secp256k1_fe_impl_mul(&local_78,x,&local_a0);
    secp256k1_fe_impl_add(&local_78,&fe_minus_one);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_78);
    if (iVar1 != 0) {
      local_48.n[4] = x->n[4];
      local_48.n[0] = x->n[0];
      local_48.n[1] = x->n[1];
      local_48.n[2] = x->n[2];
      local_48.n[3] = x->n[3];
      secp256k1_fe_impl_add(&local_48,&fe_minus_one);
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_48);
      if (iVar1 == 0) {
        (*pcVar4)(&local_48,&local_48);
        secp256k1_fe_impl_add(&local_a0,&fe_minus_one);
        (*pcVar4)(&local_a0,&local_a0);
        local_a0.n[0] = local_a0.n[0] + local_48.n[0] + 1;
        local_a0.n[1] = local_a0.n[1] + local_48.n[1];
        local_a0.n[2] = local_a0.n[2] + local_48.n[2];
        local_a0.n[3] = local_a0.n[3] + local_48.n[3];
        local_a0.n[4] = local_a0.n[4] + local_48.n[4];
        iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_a0);
        if (iVar1 == 0) {
          pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero_var(&l)";
          uVar2 = 0xcf2;
          goto LAB_00130082;
        }
      }
      return;
    }
    pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero(&t)";
    uVar2 = 0xce9;
  }
  else {
    iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_a0);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero(&l)";
    uVar2 = 0xce4;
  }
LAB_00130082:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}